

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  byte *cur;
  CLzRef *pCVar2;
  int iVar3;
  UInt32 maxLen;
  UInt32 UVar4;
  UInt32 *pUVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  UInt32 UVar11;
  
  lenLimit = p->lenLimit;
  if ((ulong)lenLimit < 3) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar7 = (uint)cur[1] ^ p->crc[*cur];
  uVar8 = uVar7 & 0x3ff;
  pCVar2 = p->hash;
  CVar1 = p->pos;
  uVar6 = CVar1 - pCVar2[uVar8];
  uVar7 = (((uint)cur[2] << 8 ^ uVar7) & p->hashMask) + 0x400;
  UVar11 = pCVar2[uVar7];
  pCVar2[uVar8] = CVar1;
  pCVar2[uVar7] = CVar1;
  UVar4 = p->cyclicBufferSize;
  maxLen = 2;
  if ((uVar6 < UVar4) && (cur[-(ulong)uVar6] == *cur)) {
    pbVar9 = cur + 2;
    iVar3 = (int)cur + lenLimit;
    for (lVar10 = (ulong)lenLimit - 2; lVar10 != 0; lVar10 = lVar10 + -1) {
      if (pbVar9[-(ulong)uVar6] != *pbVar9) {
        iVar3 = (int)pbVar9;
        break;
      }
      pbVar9 = pbVar9 + 1;
    }
    maxLen = iVar3 - (int)cur;
    *distances = maxLen;
    distances[1] = uVar6 - 1;
    UVar4 = p->cyclicBufferSize;
    if (lenLimit == maxLen) {
      SkipMatchesSpec(lenLimit,UVar11,p->pos,cur,p->son,p->cyclicBufferPos,UVar4,p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      UVar11 = 2;
      goto LAB_00111073;
    }
    lVar10 = 2;
  }
  else {
    lVar10 = 0;
  }
  pUVar5 = GetMatchesSpec1(lenLimit,UVar11,p->pos,cur,p->son,p->cyclicBufferPos,UVar4,p->cutValue,
                           distances + lVar10,maxLen);
  UVar11 = (UInt32)((ulong)((long)pUVar5 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar4 = p->pos + 1;
  p->pos = UVar4;
LAB_00111073:
  if (UVar4 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar11;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, d2, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[h2];

  curMatch = hash[kFix3HashSize + hv];
  
  hash[h2] = pos;
  hash[kFix3HashSize + hv] = pos;

  maxLen = 2;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    UPDATE_maxLen
    distances[0] = maxLen;
    distances[1] = d2 - 1;
    offset = 2;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  GET_MATCHES_FOOTER(offset, maxLen)
}